

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_brk3(DisasContext_conflict1 *s,arg_rprr_s *a,undefined1 *fn,gen_helper_gvec_flags_4 *fn_s)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  _Bool _Var2;
  int iVar3;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_ptr r_01;
  TCGv_ptr r_02;
  TCGv_i32 t_00;
  TCGv_i32 t;
  TCGv_ptr g;
  TCGv_ptr m;
  TCGv_ptr n;
  TCGv_ptr d;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_gvec_flags_4 *fn_s_local;
  undefined1 *fn_local;
  arg_rprr_s *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    iVar3 = pred_full_reg_size(s);
    r = tcg_temp_new_ptr(tcg_ctx_00);
    r_00 = tcg_temp_new_ptr(tcg_ctx_00);
    r_01 = tcg_temp_new_ptr(tcg_ctx_00);
    r_02 = tcg_temp_new_ptr(tcg_ctx_00);
    t_00 = tcg_const_i32_aarch64(tcg_ctx_00,iVar3 + -2);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,a->rd);
    tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar1,(long)iVar3);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,a->rn);
    tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar1,(long)iVar3);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,a->rm);
    tcg_gen_addi_ptr(tcg_ctx_00,r_01,pTVar1,(long)iVar3);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar3 = pred_full_reg_offset(s,a->pg);
    tcg_gen_addi_ptr(tcg_ctx_00,r_02,pTVar1,(long)iVar3);
    if (a->s == 0) {
      (*(code *)fn)(tcg_ctx_00,r,r_00,r_01,r_02,t_00);
    }
    else {
      (*fn_s)(tcg_ctx_00,t_00,r,r_00,r_01,r_02,t_00);
      do_pred_flags(tcg_ctx_00,t_00);
    }
    tcg_temp_free_ptr(tcg_ctx_00,r);
    tcg_temp_free_ptr(tcg_ctx_00,r_00);
    tcg_temp_free_ptr(tcg_ctx_00,r_01);
    tcg_temp_free_ptr(tcg_ctx_00,r_02);
    tcg_temp_free_i32(tcg_ctx_00,t_00);
  }
  return true;
}

Assistant:

static bool do_brk3(DisasContext *s, arg_rprr_s *a,
                    gen_helper_gvec_4 *fn, gen_helper_gvec_flags_4 *fn_s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned vsz = pred_full_reg_size(s);

    /* Predicate sizes may be smaller and cannot use simd_desc.  */
    TCGv_ptr d = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr n = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr m = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr g = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i32 t = tcg_const_i32(tcg_ctx, vsz - 2);

    tcg_gen_addi_ptr(tcg_ctx, d, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, n, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, m, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rm));
    tcg_gen_addi_ptr(tcg_ctx, g, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));

    if (a->s) {
        fn_s(tcg_ctx, t, d, n, m, g, t);
        do_pred_flags(tcg_ctx, t);
    } else {
        fn(tcg_ctx, d, n, m, g, t);
    }
    tcg_temp_free_ptr(tcg_ctx, d);
    tcg_temp_free_ptr(tcg_ctx, n);
    tcg_temp_free_ptr(tcg_ctx, m);
    tcg_temp_free_ptr(tcg_ctx, g);
    tcg_temp_free_i32(tcg_ctx, t);
    return true;
}